

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  int value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  CppType CVar3;
  string *psVar4;
  Descriptor *pDVar5;
  string *psVar6;
  EnumDescriptor *pEVar7;
  OneofDescriptor *pOVar8;
  char *pcVar9;
  FieldOptions *pFVar10;
  FieldOptions *pFVar11;
  int __c;
  string local_40;
  Type local_20;
  Label local_1c;
  FieldDescriptorProto *local_18;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *this_local;
  
  local_18 = proto;
  proto_local = (FieldDescriptorProto *)this;
  psVar4 = name_abi_cxx11_(this);
  FieldDescriptorProto::set_name(proto,psVar4);
  pFVar1 = local_18;
  value = number(this);
  FieldDescriptorProto::set_number(pFVar1,value);
  pFVar1 = local_18;
  if (((byte)this[0x20] & 1) != 0) {
    psVar4 = json_name_abi_cxx11_(this);
    FieldDescriptorProto::set_json_name(pFVar1,psVar4);
  }
  pFVar1 = local_18;
  local_1c = label(this);
  value_00 = internal::implicit_cast<int,google::protobuf::FieldDescriptor::Label>(&local_1c);
  FieldDescriptorProto::set_label(pFVar1,value_00);
  pFVar1 = local_18;
  local_20 = type(this);
  value_01 = internal::implicit_cast<int,google::protobuf::FieldDescriptor::Type>(&local_20);
  psVar4 = (string *)(ulong)value_01;
  FieldDescriptorProto::set_type(pFVar1,value_01);
  bVar2 = is_extension(this);
  if (bVar2) {
    pDVar5 = containing_type(this);
    if (((byte)pDVar5[0x29] & 1) == 0) {
      FieldDescriptorProto::set_extendee(local_18,".");
    }
    psVar6 = FieldDescriptorProto::mutable_extendee_abi_cxx11_(local_18);
    pDVar5 = containing_type(this);
    psVar4 = Descriptor::full_name_abi_cxx11_(pDVar5);
    std::__cxx11::string::append((string *)psVar6);
  }
  CVar3 = cpp_type(this);
  if (CVar3 == CPPTYPE_MESSAGE) {
    pDVar5 = message_type(this);
    if (((byte)pDVar5[0x28] & 1) != 0) {
      FieldDescriptorProto::clear_type(local_18);
    }
    pDVar5 = message_type(this);
    if (((byte)pDVar5[0x29] & 1) == 0) {
      FieldDescriptorProto::set_type_name(local_18,".");
    }
    psVar6 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_18);
    pDVar5 = message_type(this);
    psVar4 = Descriptor::full_name_abi_cxx11_(pDVar5);
    std::__cxx11::string::append((string *)psVar6);
  }
  else {
    CVar3 = cpp_type(this);
    if (CVar3 == CPPTYPE_ENUM) {
      pEVar7 = enum_type(this);
      if (((byte)pEVar7[0x29] & 1) == 0) {
        FieldDescriptorProto::set_type_name(local_18,".");
      }
      psVar6 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_18);
      pEVar7 = enum_type(this);
      psVar4 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
      std::__cxx11::string::append((string *)psVar6);
    }
  }
  bVar2 = has_default_value(this);
  pFVar1 = local_18;
  if (bVar2) {
    psVar4 = &local_40;
    DefaultValueAsString_abi_cxx11_(psVar4,this,false);
    FieldDescriptorProto::set_default_value(pFVar1,psVar4);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pOVar8 = containing_oneof(this);
  if ((pOVar8 != (OneofDescriptor *)0x0) && (bVar2 = is_extension(this), pFVar1 = local_18, !bVar2))
  {
    pOVar8 = containing_oneof(this);
    pcVar9 = OneofDescriptor::index(pOVar8,(char *)psVar4,__c);
    FieldDescriptorProto::set_oneof_index(pFVar1,(int32)pcVar9);
  }
  pFVar10 = options(this);
  pFVar11 = FieldOptions::default_instance();
  if (pFVar10 != pFVar11) {
    pFVar10 = FieldDescriptorProto::mutable_options(local_18);
    pFVar11 = options(this);
    FieldOptions::CopyFrom(pFVar10,pFVar11);
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != NULL && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}